

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_543c74::ReferenceType::printLeft(ReferenceType *this,OutputStream *s)

{
  int iVar1;
  Node *pNVar2;
  char *__src;
  size_t Size;
  size_t N;
  bool bVar3;
  pair<(anonymous_namespace)::ReferenceKind,_const_(anonymous_namespace)::Node_*> pVar4;
  
  if (this->Printing != false) {
    return;
  }
  this->Printing = true;
  pVar4 = collapse((ReferenceType *)this->Pointee,(OutputStream *)(ulong)this->RK);
  pNVar2 = pVar4.second;
  (*pNVar2->_vptr_Node[4])(pNVar2,s);
  if (pNVar2->ArrayCache == Yes) {
LAB_001baef6:
    OutputStream::grow(s,1);
    s->Buffer[s->CurrentPosition] = ' ';
    s->CurrentPosition = s->CurrentPosition + 1;
LAB_001baf12:
    if ((pNVar2->ArrayCache != Yes) &&
       ((pNVar2->ArrayCache != Unknown ||
        (iVar1 = (*pNVar2->_vptr_Node[1])(pNVar2,s), (char)iVar1 == '\0')))) goto LAB_001baf30;
  }
  else {
    if (pNVar2->ArrayCache == Unknown) {
      iVar1 = (*pNVar2->_vptr_Node[1])(pNVar2,s);
      if ((char)iVar1 != '\0') goto LAB_001baef6;
      goto LAB_001baf12;
    }
LAB_001baf30:
    if ((pNVar2->FunctionCache != Yes) &&
       ((pNVar2->FunctionCache != Unknown ||
        (iVar1 = (*pNVar2->_vptr_Node[2])(pNVar2,s), (char)iVar1 == '\0')))) goto LAB_001baf6a;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = '(';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001baf6a:
  bVar3 = pVar4.first != LValue;
  __src = "&&";
  if (!bVar3) {
    __src = "&";
  }
  N = (ulong)bVar3 + 1;
  OutputStream::grow(s,N);
  memcpy(s->Buffer + s->CurrentPosition,__src,N);
  s->CurrentPosition = s->CurrentPosition + N;
  this->Printing = false;
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    if (Printing)
      return;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    std::pair<ReferenceKind, const Node *> Collapsed = collapse(s);
    Collapsed.second->printLeft(s);
    if (Collapsed.second->hasArray(s))
      s += " ";
    if (Collapsed.second->hasArray(s) || Collapsed.second->hasFunction(s))
      s += "(";

    s += (Collapsed.first == ReferenceKind::LValue ? "&" : "&&");
  }